

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Btree * sqlite3DbNameToBtree(sqlite3 *db,char *zDbName)

{
  byte bVar1;
  Btree *pBVar2;
  byte *pbVar3;
  ulong uVar4;
  long lVar5;
  uchar *b;
  byte *pbVar6;
  
  if ((long)db->nDb < 1) {
    return (Btree *)0x0;
  }
  lVar5 = 0;
  do {
    pBVar2 = db->aDb[lVar5].pBt;
    if (pBVar2 != (Btree *)0x0) {
      if (zDbName == (char *)0x0) {
        return pBVar2;
      }
      pbVar6 = (byte *)db->aDb[lVar5].zName;
      bVar1 = *zDbName;
      pbVar3 = (byte *)(zDbName + 1);
      while (bVar1 != 0) {
        uVar4 = (ulong)bVar1;
        if (""[uVar4] != ""[*pbVar6]) goto LAB_00154f2e;
        pbVar6 = pbVar6 + 1;
        bVar1 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      }
      uVar4 = 0;
LAB_00154f2e:
      if (""[uVar4] == ""[*pbVar6]) {
        return pBVar2;
      }
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == db->nDb) {
      return (Btree *)0x0;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE Btree *sqlite3DbNameToBtree(sqlite3 *db, const char *zDbName){
  int i;
  for(i=0; i<db->nDb; i++){
    if( db->aDb[i].pBt
     && (zDbName==0 || sqlite3StrICmp(zDbName, db->aDb[i].zName)==0)
    ){
      return db->aDb[i].pBt;
    }
  }
  return 0;
}